

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.h
# Opt level: O0

void __thiscall ON_ClippingPlane::ON_ClippingPlane(ON_ClippingPlane *this,ON_ClippingPlane *param_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  char cVar11;
  unsigned_short uVar12;
  unsigned_short uVar13;
  ON_ClippingPlane *param_1_local;
  ON_ClippingPlane *this_local;
  
  dVar1 = (param_1->m_plane).plane_equation.d;
  (this->m_plane).plane_equation.z = (param_1->m_plane).plane_equation.z;
  (this->m_plane).plane_equation.d = dVar1;
  dVar1 = (param_1->m_plane).plane_equation.y;
  (this->m_plane).plane_equation.x = (param_1->m_plane).plane_equation.x;
  (this->m_plane).plane_equation.y = dVar1;
  dVar1 = (param_1->m_plane).zaxis.z;
  (this->m_plane).zaxis.y = (param_1->m_plane).zaxis.y;
  (this->m_plane).zaxis.z = dVar1;
  dVar1 = (param_1->m_plane).zaxis.x;
  (this->m_plane).yaxis.z = (param_1->m_plane).yaxis.z;
  (this->m_plane).zaxis.x = dVar1;
  dVar1 = (param_1->m_plane).origin.x;
  dVar2 = (param_1->m_plane).origin.y;
  dVar3 = (param_1->m_plane).origin.z;
  dVar4 = (param_1->m_plane).xaxis.x;
  dVar5 = (param_1->m_plane).xaxis.y;
  dVar6 = (param_1->m_plane).xaxis.z;
  dVar7 = (param_1->m_plane).yaxis.y;
  (this->m_plane).yaxis.x = (param_1->m_plane).yaxis.x;
  (this->m_plane).yaxis.y = dVar7;
  (this->m_plane).xaxis.y = dVar5;
  (this->m_plane).xaxis.z = dVar6;
  (this->m_plane).origin.z = dVar3;
  (this->m_plane).xaxis.x = dVar4;
  (this->m_plane).origin.x = dVar1;
  (this->m_plane).origin.y = dVar2;
  ON_UuidList::ON_UuidList(&this->m_viewport_ids,&param_1->m_viewport_ids);
  bVar9 = param_1->m_depth_enabled;
  bVar10 = param_1->m_participation_lists_enabled;
  cVar11 = param_1->m_reserved;
  this->m_bEnabled = param_1->m_bEnabled;
  this->m_depth_enabled = bVar9;
  this->m_participation_lists_enabled = bVar10;
  this->m_reserved = cVar11;
  uVar12 = (param_1->m_plane_id).Data2;
  uVar13 = (param_1->m_plane_id).Data3;
  uVar8 = *(undefined8 *)(param_1->m_plane_id).Data4;
  (this->m_plane_id).Data1 = (param_1->m_plane_id).Data1;
  (this->m_plane_id).Data2 = uVar12;
  (this->m_plane_id).Data3 = uVar13;
  *(undefined8 *)(this->m_plane_id).Data4 = uVar8;
  ON_ClippingPlaneDataStore::ON_ClippingPlaneDataStore(&this->m_data_store,&param_1->m_data_store);
  return;
}

Assistant:

class ON_CLASS ON_ClippingPlane
{
public:
  ON_ClippingPlane();
  ~ON_ClippingPlane();

  void Default();

  ON_Plane m_plane;
  ON_UuidList m_viewport_ids; //ids of viewports that this clipping plane "clips"
  ON_UUID m_plane_id;
  bool m_bEnabled; // true if this clipping plane is active

  ON_ClippingPlaneInfo ClippingPlaneInfo() const;

  // A distance where the clipping plane does not clip geometry.
  // A positive value is equivalent to placing another clipping plane at a
  // distance from this clipping plane along it's normal and then flipping it
  //
  // The depth must also be enabled to be effective
  double Depth() const;

  // Negative depth values are currently not allowed. If a negative depth value
  // is passed to this function, it will not the the internal depth value
  void SetDepth(double depth);

  // Default is false
  bool DepthEnabled() const;
  void SetDepthEnabled(bool on);

  // Default is false
  bool ParticipationListsEnabled() const;
  void SetParticipationListsEnabled(bool on);

  void SetParticipationLists(
    const ON_SimpleArray<ON_UUID>* objectIds,
    const ON_SimpleArray<int>* layerIndices,
    bool isExclusionList);

  const ON_UuidList* ObjectClipParticipationList() const;
  const ON_SimpleArray<int>* LayerClipParticipationList() const;
  bool ClipParticipationListsAreExclusionLists() const;

  bool Read( class ON_BinaryArchive& );
  bool Write( class ON_BinaryArchive& ) const;

private:
  bool m_depth_enabled = false;
  bool m_participation_lists_enabled = false;
  char m_reserved;
  
  ON_ClippingPlaneDataStore m_data_store;
}